

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O0

int xmlNanoHTTPSave(void *ctxt,char *filename)

{
  int iVar1;
  ssize_t sVar2;
  int local_34;
  int local_30;
  int ret;
  int len;
  int fd;
  char *buf;
  char *filename_local;
  void *ctxt_local;
  
  _len = (char *)0x0;
  local_34 = 0;
  if ((ctxt == (void *)0x0) || (filename == (char *)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    buf = filename;
    filename_local = (char *)ctxt;
    iVar1 = strcmp(filename,"-");
    if (iVar1 == 0) {
      ret = 0;
    }
    else {
      ret = open64(buf,0x41,0x1b6);
      if (ret < 0) {
        xmlNanoHTTPClose(filename_local);
        return -1;
      }
    }
    xmlNanoHTTPFetchContent(filename_local,(char **)&len,&local_30);
    if ((0 < local_30) && (sVar2 = write(ret,_len,(long)local_30), sVar2 == -1)) {
      local_34 = -1;
    }
    xmlNanoHTTPClose(filename_local);
    close(ret);
    ctxt_local._4_4_ = local_34;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlNanoHTTPSave(void *ctxt, const char *filename) {
    char *buf = NULL;
    int fd;
    int len;
    int ret = 0;

    if ((ctxt == NULL) || (filename == NULL)) return(-1);

    if (!strcmp(filename, "-"))
        fd = 0;
    else {
        fd = open(filename, O_CREAT | O_WRONLY, 0666);
	if (fd < 0) {
	    xmlNanoHTTPClose(ctxt);
	    return(-1);
	}
    }

    xmlNanoHTTPFetchContent( ctxt, &buf, &len );
    if ( len > 0 ) {
	if (write(fd, buf, len) == -1) {
	    ret = -1;
	}
    }

    xmlNanoHTTPClose(ctxt);
    close(fd);
    return(ret);
}